

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Asset.h
# Opt level: O3

void __thiscall glTF2::Asset::Asset(Asset *this,IOSystem *io)

{
  vector<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_> *this_00;
  _Rb_tree_header *p_Var1;
  pointer *pppLVar2;
  LazyDict<glTF2::Node> *pLVar3;
  iterator iVar4;
  LazyDict<glTF2::Accessor> *local_b0 [2];
  vector<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *local_a0;
  vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>> *local_98;
  LazyDict<glTF2::Node> *local_90;
  LazyDict<glTF2::Mesh> *local_88;
  LazyDict<glTF2::Material> *local_80;
  LazyDict<glTF2::Image> *local_78;
  LazyDict<glTF2::Light> *local_70;
  LazyDict<glTF2::Camera> *local_68;
  LazyDict<glTF2::BufferView> *local_60;
  LazyDict<glTF2::Buffer> *local_58;
  LazyDict<glTF2::Animation> *local_50;
  LazyDict<glTF2::Accessor> *local_48;
  AssetMetadata *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  this->mIOSystem = io;
  local_38 = &(this->mCurrentAssetDir).field_2;
  (this->mCurrentAssetDir)._M_dataplus._M_p = (pointer)local_38;
  (this->mCurrentAssetDir)._M_string_length = 0;
  (this->mCurrentAssetDir).field_2._M_local_buf[0] = '\0';
  this_00 = &this->mDicts;
  (this->mDicts).super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mDicts).super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mDicts).super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->mUsedIds)._M_t._M_impl.super__Rb_tree_header;
  (this->mUsedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mUsedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mUsedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mUsedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_40 = &this->asset;
  (this->mUsedIds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mBodyBuffer).vector = (vector<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_> *)0x0;
  (this->mBodyBuffer).index = 0;
  local_98 = (vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>> *)this_00;
  AssetMetadata::AssetMetadata(local_40);
  local_b0[0] = &this->accessors;
  (this->accessors).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_009b1b30;
  (this->accessors).mObjs.super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->accessors).mObjs.super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->accessors).mObjs.super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->accessors).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header;
  (this->accessors).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->accessors).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->accessors).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->accessors).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->accessors).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->accessors).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->accessors).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->accessors).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->accessors).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->accessors).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->accessors).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->accessors).mDictId = "accessors";
  (this->accessors).mExtId = (char *)0x0;
  (this->accessors).mDict = (Value *)0x0;
  (this->accessors).mAsset = this;
  iVar4._M_current =
       (this->mDicts).
       super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48 = local_b0[0];
  if (iVar4._M_current ==
      (this->mDicts).
      super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>>::
    _M_realloc_insert<glTF2::LazyDictBase*>
              ((vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>> *)this_00,iVar4,
               (LazyDictBase **)local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = &local_b0[0]->super_LazyDictBase;
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0[0] = (LazyDict<glTF2::Accessor> *)&this->animations;
  (this->animations).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_009b1c00;
  (this->animations).mObjs.
  super__Vector_base<glTF2::Animation_*,_std::allocator<glTF2::Animation_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->animations).mObjs.
  super__Vector_base<glTF2::Animation_*,_std::allocator<glTF2::Animation_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->animations).mObjs.
  super__Vector_base<glTF2::Animation_*,_std::allocator<glTF2::Animation_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->animations).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header;
  (this->animations).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->animations).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->animations).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->animations).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->animations).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->animations).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->animations).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->animations).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->animations).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->animations).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->animations).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->animations).mDictId = "animations";
  (this->animations).mExtId = (char *)0x0;
  (this->animations).mDict = (Value *)0x0;
  (this->animations).mAsset = this;
  local_50 = (LazyDict<glTF2::Animation> *)local_b0[0];
  if (iVar4._M_current ==
      (this->mDicts).
      super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>>::
    _M_realloc_insert<glTF2::LazyDictBase*>
              ((vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>> *)this_00,iVar4,
               (LazyDictBase **)local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0[0];
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0[0] = (LazyDict<glTF2::Accessor> *)&this->buffers;
  (this->buffers).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_009b1c50;
  (this->buffers).mObjs.super__Vector_base<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffers).mObjs.super__Vector_base<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffers).mObjs.super__Vector_base<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->buffers).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header;
  (this->buffers).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->buffers).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->buffers).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->buffers).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->buffers).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->buffers).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->buffers).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->buffers).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->buffers).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->buffers).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->buffers).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->buffers).mDictId = "buffers";
  (this->buffers).mExtId = (char *)0x0;
  (this->buffers).mDict = (Value *)0x0;
  (this->buffers).mAsset = this;
  local_58 = (LazyDict<glTF2::Buffer> *)local_b0[0];
  if (iVar4._M_current ==
      (this->mDicts).
      super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>>::
    _M_realloc_insert<glTF2::LazyDictBase*>
              ((vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>> *)this_00,iVar4,
               (LazyDictBase **)local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0[0];
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0[0] = (LazyDict<glTF2::Accessor> *)&this->bufferViews;
  (this->bufferViews).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_009b1ca0;
  (this->bufferViews).mObjs.
  super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bufferViews).mObjs.
  super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bufferViews).mObjs.
  super__Vector_base<glTF2::BufferView_*,_std::allocator<glTF2::BufferView_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->bufferViews).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header;
  (this->bufferViews).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bufferViews).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->bufferViews).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->bufferViews).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->bufferViews).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->bufferViews).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->bufferViews).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bufferViews).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->bufferViews).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->bufferViews).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->bufferViews).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->bufferViews).mDictId = "bufferViews";
  (this->bufferViews).mExtId = (char *)0x0;
  (this->bufferViews).mDict = (Value *)0x0;
  (this->bufferViews).mAsset = this;
  local_60 = (LazyDict<glTF2::BufferView> *)local_b0[0];
  if (iVar4._M_current ==
      (this->mDicts).
      super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>>::
    _M_realloc_insert<glTF2::LazyDictBase*>
              ((vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>> *)this_00,iVar4,
               (LazyDictBase **)local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0[0];
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0[0] = (LazyDict<glTF2::Accessor> *)&this->cameras;
  (this->cameras).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_009b1cf0;
  (this->cameras).mObjs.super__Vector_base<glTF2::Camera_*,_std::allocator<glTF2::Camera_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cameras).mObjs.super__Vector_base<glTF2::Camera_*,_std::allocator<glTF2::Camera_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cameras).mObjs.super__Vector_base<glTF2::Camera_*,_std::allocator<glTF2::Camera_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->cameras).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header;
  (this->cameras).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->cameras).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->cameras).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->cameras).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->cameras).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->cameras).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->cameras).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->cameras).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->cameras).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->cameras).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->cameras).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->cameras).mDictId = "cameras";
  (this->cameras).mExtId = (char *)0x0;
  (this->cameras).mDict = (Value *)0x0;
  (this->cameras).mAsset = this;
  local_68 = (LazyDict<glTF2::Camera> *)local_b0[0];
  if (iVar4._M_current ==
      (this->mDicts).
      super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>>::
    _M_realloc_insert<glTF2::LazyDictBase*>
              ((vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>> *)this_00,iVar4,
               (LazyDictBase **)local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0[0];
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0[0] = (LazyDict<glTF2::Accessor> *)&this->lights;
  (this->lights).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_009b1d40;
  (this->lights).mObjs.super__Vector_base<glTF2::Light_*,_std::allocator<glTF2::Light_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lights).mObjs.super__Vector_base<glTF2::Light_*,_std::allocator<glTF2::Light_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lights).mObjs.super__Vector_base<glTF2::Light_*,_std::allocator<glTF2::Light_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->lights).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header;
  (this->lights).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->lights).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->lights).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->lights).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->lights).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->lights).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->lights).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->lights).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->lights).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->lights).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->lights).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->lights).mDictId = "lights";
  (this->lights).mExtId = "KHR_lights_punctual";
  (this->lights).mDict = (Value *)0x0;
  (this->lights).mAsset = this;
  local_70 = (LazyDict<glTF2::Light> *)local_b0[0];
  if (iVar4._M_current ==
      (this->mDicts).
      super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>>::
    _M_realloc_insert<glTF2::LazyDictBase*>
              ((vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>> *)this_00,iVar4,
               (LazyDictBase **)local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0[0];
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0[0] = (LazyDict<glTF2::Accessor> *)&this->images;
  (this->images).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_009b1d90;
  (this->images).mObjs.super__Vector_base<glTF2::Image_*,_std::allocator<glTF2::Image_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->images).mObjs.super__Vector_base<glTF2::Image_*,_std::allocator<glTF2::Image_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->images).mObjs.super__Vector_base<glTF2::Image_*,_std::allocator<glTF2::Image_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->images).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header;
  (this->images).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->images).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->images).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->images).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->images).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->images).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->images).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->images).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->images).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->images).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->images).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->images).mDictId = "images";
  (this->images).mExtId = (char *)0x0;
  (this->images).mDict = (Value *)0x0;
  (this->images).mAsset = this;
  local_78 = (LazyDict<glTF2::Image> *)local_b0[0];
  if (iVar4._M_current ==
      (this->mDicts).
      super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>>::
    _M_realloc_insert<glTF2::LazyDictBase*>
              ((vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>> *)this_00,iVar4,
               (LazyDictBase **)local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0[0];
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0[0] = (LazyDict<glTF2::Accessor> *)&this->materials;
  (this->materials).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_009b1de0;
  (this->materials).mObjs.super__Vector_base<glTF2::Material_*,_std::allocator<glTF2::Material_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->materials).mObjs.super__Vector_base<glTF2::Material_*,_std::allocator<glTF2::Material_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->materials).mObjs.super__Vector_base<glTF2::Material_*,_std::allocator<glTF2::Material_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->materials).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header;
  (this->materials).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->materials).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->materials).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->materials).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->materials).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->materials).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->materials).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->materials).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->materials).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->materials).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->materials).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->materials).mDictId = "materials";
  (this->materials).mExtId = (char *)0x0;
  (this->materials).mDict = (Value *)0x0;
  (this->materials).mAsset = this;
  local_80 = (LazyDict<glTF2::Material> *)local_b0[0];
  if (iVar4._M_current ==
      (this->mDicts).
      super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>>::
    _M_realloc_insert<glTF2::LazyDictBase*>
              ((vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>> *)this_00,iVar4,
               (LazyDictBase **)local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0[0];
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0[0] = (LazyDict<glTF2::Accessor> *)&this->meshes;
  (this->meshes).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_009b1e30;
  (this->meshes).mObjs.super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->meshes).mObjs.super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->meshes).mObjs.super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->meshes).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header;
  (this->meshes).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->meshes).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->meshes).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->meshes).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->meshes).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->meshes).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->meshes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->meshes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->meshes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->meshes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->meshes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->meshes).mDictId = "meshes";
  (this->meshes).mExtId = (char *)0x0;
  (this->meshes).mDict = (Value *)0x0;
  (this->meshes).mAsset = this;
  local_88 = (LazyDict<glTF2::Mesh> *)local_b0[0];
  if (iVar4._M_current ==
      (this->mDicts).
      super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>>::
    _M_realloc_insert<glTF2::LazyDictBase*>
              ((vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>> *)this_00,iVar4,
               (LazyDictBase **)local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0[0];
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  pLVar3 = &this->nodes;
  (this->nodes).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_009b1e80;
  (this->nodes).mObjs.super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes).mObjs.super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes).mObjs.super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->nodes).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header;
  (this->nodes).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nodes).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->nodes).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->nodes).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->nodes).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->nodes).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->nodes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nodes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nodes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->nodes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->nodes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->nodes).mDictId = "nodes";
  (this->nodes).mExtId = (char *)0x0;
  (this->nodes).mDict = (Value *)0x0;
  (this->nodes).mAsset = this;
  if (iVar4._M_current ==
      (this->mDicts).
      super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_a0 = &(this->nodes).mObjs;
    local_b0[0] = (LazyDict<glTF2::Accessor> *)pLVar3;
    std::vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>>::
    _M_realloc_insert<glTF2::LazyDictBase*>
              ((vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>> *)this_00,iVar4,
               (LazyDictBase **)local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = &pLVar3->super_LazyDictBase;
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0[0] = (LazyDict<glTF2::Accessor> *)&this->samplers;
  (this->samplers).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_009b1ed0;
  (this->samplers).mObjs.super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->samplers).mObjs.super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->samplers).mObjs.super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->samplers).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header;
  (this->samplers).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->samplers).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->samplers).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->samplers).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->samplers).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->samplers).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->samplers).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->samplers).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->samplers).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->samplers).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->samplers).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->samplers).mDictId = "samplers";
  (this->samplers).mExtId = (char *)0x0;
  (this->samplers).mDict = (Value *)0x0;
  (this->samplers).mAsset = this;
  local_90 = pLVar3;
  if (iVar4._M_current ==
      (this->mDicts).
      super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>>::
    _M_realloc_insert<glTF2::LazyDictBase*>(local_98,iVar4,(LazyDictBase **)local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0[0];
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0[0] = (LazyDict<glTF2::Accessor> *)&this->scenes;
  (this->scenes).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_009b1f20;
  (this->scenes).mObjs.super__Vector_base<glTF2::Scene_*,_std::allocator<glTF2::Scene_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->scenes).mObjs.super__Vector_base<glTF2::Scene_*,_std::allocator<glTF2::Scene_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->scenes).mObjs.super__Vector_base<glTF2::Scene_*,_std::allocator<glTF2::Scene_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->scenes).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header;
  (this->scenes).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->scenes).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->scenes).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->scenes).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->scenes).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->scenes).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->scenes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->scenes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->scenes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->scenes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->scenes).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->scenes).mDictId = "scenes";
  (this->scenes).mExtId = (char *)0x0;
  (this->scenes).mDict = (Value *)0x0;
  (this->scenes).mAsset = this;
  if (iVar4._M_current ==
      (this->mDicts).
      super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>>::
    _M_realloc_insert<glTF2::LazyDictBase*>(local_98,iVar4,(LazyDictBase **)local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0[0];
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0[0] = (LazyDict<glTF2::Accessor> *)&this->skins;
  (this->skins).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_009b1f70;
  (this->skins).mObjs.super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->skins).mObjs.super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->skins).mObjs.super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->skins).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header;
  (this->skins).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->skins).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->skins).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->skins).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->skins).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->skins).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->skins).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->skins).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->skins).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->skins).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->skins).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->skins).mDictId = "skins";
  (this->skins).mExtId = (char *)0x0;
  (this->skins).mDict = (Value *)0x0;
  (this->skins).mAsset = this;
  if (iVar4._M_current ==
      (this->mDicts).
      super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_a0 = (vector<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *)&(this->skins).mObjs;
    std::vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>>::
    _M_realloc_insert<glTF2::LazyDictBase*>(local_98,iVar4,(LazyDictBase **)local_b0);
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0[0];
    iVar4._M_current =
         (this->mDicts).
         super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->mDicts).super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar4._M_current;
  }
  local_b0[0] = (LazyDict<glTF2::Accessor> *)&this->textures;
  (this->textures).super_LazyDictBase._vptr_LazyDictBase = (_func_int **)&PTR__LazyDict_009b1fc0;
  (this->textures).mObjs.super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->textures).mObjs.super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->textures).mObjs.super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->textures).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header;
  (this->textures).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->textures).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->textures).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->textures).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->textures).mObjsByOIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->textures).mObjsById._M_t._M_impl.super__Rb_tree_header;
  (this->textures).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->textures).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->textures).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->textures).mObjsById._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->textures).mObjsById._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->textures).mDictId = "textures";
  (this->textures).mExtId = (char *)0x0;
  (this->textures).mDict = (Value *)0x0;
  (this->textures).mAsset = this;
  if (iVar4._M_current ==
      (this->mDicts).
      super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_a0 = (vector<glTF2::Node_*,_std::allocator<glTF2::Node_*>_> *)&(this->textures).mObjs;
    std::vector<glTF2::LazyDictBase*,std::allocator<glTF2::LazyDictBase*>>::
    _M_realloc_insert<glTF2::LazyDictBase*>(local_98,iVar4,(LazyDictBase **)local_b0);
  }
  else {
    *iVar4._M_current = (LazyDictBase *)local_b0[0];
    pppLVar2 = &(this->mDicts).
                super__Vector_base<glTF2::LazyDictBase_*,_std::allocator<glTF2::LazyDictBase_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppLVar2 = *pppLVar2 + 1;
  }
  (this->scene).vector = (vector<glTF2::Scene_*,_std::allocator<glTF2::Scene_*>_> *)0x0;
  (this->scene).index = 0;
  (this->extensionsUsed).KHR_materials_pbrSpecularGlossiness = false;
  (this->extensionsUsed).KHR_materials_unlit = false;
  (this->extensionsUsed).KHR_lights_punctual = false;
  return;
}

Assistant:

Asset(IOSystem* io = 0)
            : mIOSystem(io)
            , asset()
            , accessors     (*this, "accessors")
            , animations    (*this, "animations")
            , buffers       (*this, "buffers")
            , bufferViews   (*this, "bufferViews")
            , cameras       (*this, "cameras")
            , lights        (*this, "lights", "KHR_lights_punctual")
            , images        (*this, "images")
            , materials     (*this, "materials")
            , meshes        (*this, "meshes")
            , nodes         (*this, "nodes")
            , samplers      (*this, "samplers")
            , scenes        (*this, "scenes")
            , skins         (*this, "skins")
            , textures      (*this, "textures")
        {
            memset(&extensionsUsed, 0, sizeof(extensionsUsed));
        }